

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O0

void dopost(char *s)

{
  int iVar1;
  char *s_local;
  
  if ((pd_maininstance.pd_stuff)->st_printhook == (t_printhook)0x0) {
    if ((sys_printtostderr == 0) && (iVar1 = sys_havegui(), iVar1 != 0)) {
      pdgui_vmess("::pdwindow::post","s",s);
    }
    else {
      fprintf(_stderr,"%s",s);
    }
  }
  else {
    (*(pd_maininstance.pd_stuff)->st_printhook)(s);
  }
  return;
}

Assistant:

static void dopost(const char *s)
{
    if (STUFF->st_printhook)
        (*STUFF->st_printhook)(s);
    else if (sys_printtostderr || !sys_havegui())
    {
#ifdef _WIN32
    #ifdef _MSC_VER
        fwprintf(stderr, L"%S", s);
    #else
        fwprintf(stderr, L"%s", s);
    #endif
        fflush(stderr);
#else
        fprintf(stderr, "%s", s);
#endif
    }
    else
    {
        pdgui_vmess("::pdwindow::post", "s", s);
    }
}